

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O2

bool is_vowel(char ch)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined3 in_register_00000039;
  
  iVar2 = tolower(CONCAT31(in_register_00000039,ch));
  uVar3 = (int)(char)iVar2 - 0x61;
  uVar1 = uVar3 >> 1;
  return (bool)((byte)(0x1495 >> ((byte)uVar1 & 0x1f)) &
               (uVar1 | (uint)((uVar3 & 1) != 0) << 0x1f) < 0xd);
}

Assistant:

bool is_vowel(char ch)
{
	switch (static_cast<char>(std::tolower(ch)))
	{
	case 'a':
	case 'e':
	case 'i':
	case 'o':
	case 'u':
	case 'y':
		return true;
	default:
		return false;
	}
}